

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JtagSimulationDataGenerator.cpp
# Opt level: O0

U32 __thiscall
JtagSimulationDataGenerator::GenerateSimulationData
          (JtagSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  U64 adjusted_largest_sample_requested;
  SimulationChannelDescriptor **simulation_channels_local;
  U32 sample_rate_local;
  U64 largest_sample_requested_local;
  JtagSimulationDataGenerator *this_local;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  while( true ) {
    uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    if (uVar2 <= uVar3) break;
    CreateJtagTransaction(this);
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 JtagSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                         SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mTck->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
        CreateJtagTransaction();

    *simulation_channels = mJtagSimulationChannels.GetArray();

    return mJtagSimulationChannels.GetCount();
}